

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::CanGetAddresses(DescriptorScriptPubKeyMan *this,bool internal)

{
  int iVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock64;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  iVar1 = (*((this->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Descriptor[5]
          )();
  if ((char)iVar1 != '\0') {
    iVar1 = (*((this->m_wallet_descriptor).descriptor.
               super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Descriptor
              [2])();
    if ((char)iVar1 != '\0') {
      iVar1 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0xf])(this);
      bVar2 = true;
      if ((char)iVar1 == '\0') {
        bVar2 = (this->m_wallet_descriptor).next_index < (this->m_wallet_descriptor).range_end;
      }
      goto LAB_004f1d99;
    }
  }
  bVar2 = false;
LAB_004f1d99:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::CanGetAddresses(bool internal) const
{
    // We can only give out addresses from descriptors that are single type (not combo), ranged,
    // and either have cached keys or can generate more keys (ignoring encryption)
    LOCK(cs_desc_man);
    return m_wallet_descriptor.descriptor->IsSingleType() &&
           m_wallet_descriptor.descriptor->IsRange() &&
           (HavePrivateKeys() || m_wallet_descriptor.next_index < m_wallet_descriptor.range_end);
}